

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O0

TPZFMatrix<std::complex<float>_> * __thiscall
TPZFMatrix<std::complex<float>_>::operator=
          (TPZFMatrix<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *A)

{
  TPZMatrix<std::complex<float>_> *in_RSI;
  TPZFMatrix<std::complex<float>_> *in_RDI;
  TPZVec<std::complex<float>_> *unaff_retaddr;
  TPZFMatrix<std::complex<float>_> *copy;
  
  copy = in_RDI;
  TPZMatrix<std::complex<float>_>::operator=(in_RSI,&in_RDI->super_TPZMatrix<std::complex<float>_>);
  in_RDI->fElem = (complex<float> *)in_RSI[1].super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable;
  in_RDI->fGiven = (complex<float> *)in_RSI[1].super_TPZBaseMatrix.fRow;
  in_RDI->fSize = in_RSI[1].super_TPZBaseMatrix.fCol;
  TPZManVector<int,_5>::operator=((TPZManVector<int,_5> *)this,(TPZManVector<int,_5> *)A);
  TPZVec<std::complex<float>_>::operator=(unaff_retaddr,(TPZVec<std::complex<float>_> *)copy);
  in_RSI[1].super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
  in_RSI[1].super_TPZBaseMatrix.fRow = 0;
  in_RSI[1].super_TPZBaseMatrix.fCol = 0;
  return in_RDI;
}

Assistant:

TPZFMatrix<TVar> &TPZFMatrix<TVar>::operator=(TPZFMatrix<TVar> &&A ) {
    TPZMatrix<TVar>::operator=(A);
    fElem=A.fElem;
    fGiven=A.fGiven;
    fSize=A.fSize;
    fPivot = A.fPivot;
    fWork = A.fWork;
    
    A.fElem = nullptr;
    A.fGiven = nullptr;
    A.fSize = 0;
    return *this;
}